

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

void __thiscall
srell::
regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_srell::u8regex_traits<char>_>
::regex_iterator(regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_srell::u8regex_traits<char>_>
                 *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       a,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         b,regex_type *re,match_flag_type m)

{
  (this->begin)._M_current = a._M_current;
  (this->end)._M_current = b._M_current;
  this->pregex = re;
  this->flags = m;
  (this->match).sstate_.nth.in_string._M_current = (char *)0x0;
  (this->match).sstate_.srchbegin._M_current = (char *)0x0;
  memset(&(this->match).sstate_.srchend,0,0xc0);
  (this->match).ready_ = false;
  (this->match).suffix_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  (this->match).suffix_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  (this->match).suffix_.matched = false;
  (this->match).sub_matches_.
  super__Vector_base<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->match).sub_matches_.
  super__Vector_base<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->match).sub_matches_.
  super__Vector_base<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->match).prefix_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  *(undefined8 *)
   ((long)&(this->match).prefix_.
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .first._M_current + 1) = 0;
  *(undefined8 *)
   ((long)&(this->match).prefix_.
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .second._M_current + 1) = 0;
  (this->match).base_._M_current = (char *)0x0;
  (this->match).gnames_.super_groupname_and_backrefnumber_mapper<char,_unsigned_int>.names_.buffer_
       = (pointer)0x0;
  (this->match).gnames_.super_groupname_and_backrefnumber_mapper<char,_unsigned_int>.names_.size_ =
       0;
  (this->match).gnames_.super_groupname_and_backrefnumber_mapper<char,_unsigned_int>.names_.
  capacity_ = 0;
  (this->match).gnames_.super_groupname_and_backrefnumber_mapper<char,_unsigned_int>.
  keysize_classno_.buffer_ = (pointer)0x0;
  (this->match).gnames_.super_groupname_and_backrefnumber_mapper<char,_unsigned_int>.
  keysize_classno_.size_ = 0;
  (this->match).gnames_.super_groupname_and_backrefnumber_mapper<char,_unsigned_int>.
  keysize_classno_.capacity_ = 0;
  regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<srell::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,srell::u8regex_traits<char>>
            (a,b,a,&this->match,re,m);
  return;
}

Assistant:

regex_iterator(
		const BidirectionalIterator a,
		const BidirectionalIterator b,
		const regex_type &re,
		const regex_constants::match_flag_type m = regex_constants::match_default)
		: begin(a), end(b), pregex(&re), flags(m)
	{
		regex_search(begin, end, begin, match, *pregex, flags);
			//  28.12.1.1: If this call returns false the constructor
			//    sets *this to the end-of-sequence iterator.
	}